

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPUDetailsWidget.cpp
# Opt level: O0

bool __thiscall GPUDetailsWidget::event(GPUDetailsWidget *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QPoint *pQVar4;
  byte local_91;
  QRect local_88;
  QString local_78;
  byte local_49;
  QString local_48;
  long local_30;
  QWidget *child;
  QHelpEvent *helpEvent;
  QEvent *event_local;
  GPUDetailsWidget *this_local;
  
  helpEvent = (QHelpEvent *)event;
  event_local = (QEvent *)this;
  TVar3 = QEvent::type(event);
  if (TVar3 == ToolTip) {
    child = (QWidget *)helpEvent;
    QHelpEvent::pos(helpEvent);
    local_30 = QWidget::childAt((QPoint *)this);
    local_49 = 0;
    local_91 = 0;
    if (local_30 != 0) {
      QWidget::toolTip();
      local_49 = 1;
      bVar1 = QString::isEmpty(&local_48);
      local_91 = bVar1 ^ 0xff;
    }
    if ((local_49 & 1) != 0) {
      QString::~QString(&local_48);
    }
    if ((local_91 & 1) == 0) {
      QToolTip::hideText();
      QEvent::ignore((QEvent *)helpEvent);
      this_local._7_1_ = true;
    }
    else {
      pQVar4 = QHelpEvent::globalPos((QHelpEvent *)child);
      QWidget::toolTip();
      QRect::QRect(&local_88);
      QToolTip::showText((QPoint *)pQVar4,(QString *)&local_78,(QWidget *)0x0,(QRect *)&local_88,-1)
      ;
      QString::~QString(&local_78);
      this_local._7_1_ = true;
    }
  }
  else {
    bVar2 = QWidget::event((QEvent *)this);
    this_local._7_1_ = (bool)(bVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool GPUDetailsWidget::event(QEvent *event) {
    if (event->type() == QEvent::ToolTip) {
        auto helpEvent = static_cast<QHelpEvent*>(event);

        if (auto child = childAt(helpEvent->pos()); child && !child->toolTip().isEmpty()) {
            QToolTip::showText(helpEvent->globalPos(), child->toolTip());
            return true;
        }

        QToolTip::hideText();
        event->ignore();

        return true;
    }

    return QWidget::event(event);
}